

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::api::anon_unknown_0::BuffersTestCase::createInstance(BuffersTestCase *this,Context *ctx)

{
  MessageBuilder *this_00;
  BufferTestInstance *this_01;
  Bitfield<32UL> local_1b8;
  MessageBuilder local_1a0;
  TestLog *local_20;
  TestLog *log;
  Context *ctx_local;
  BuffersTestCase *this_local;
  
  log = (TestLog *)ctx;
  ctx_local = (Context *)this;
  local_20 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  ::vk::getBufferUsageFlagsStr(&local_1b8,(this->m_testCase).usage);
  this_00 = tcu::MessageBuilder::operator<<(&local_1a0,&local_1b8);
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  this_01 = (BufferTestInstance *)operator_new(0x30);
  BufferTestInstance::BufferTestInstance(this_01,(Context *)log,this->m_testCase);
  return &this_01->super_TestInstance;
}

Assistant:

virtual TestInstance*	createInstance		(Context&				ctx) const
							{
								tcu::TestLog& log	= m_testCtx.getLog();
								log << tcu::TestLog::Message << getBufferUsageFlagsStr(m_testCase.usage) << tcu::TestLog::EndMessage;
								return new BufferTestInstance(ctx, m_testCase);
							}